

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc64_fast.c
# Opt level: O3

uint64_t lzma_crc64(uint8_t *buf,size_t size,uint64_t crc)

{
  ulong uVar1;
  ulong uVar2;
  uint *puVar3;
  size_t sVar4;
  uint8_t *puVar5;
  uint uVar6;
  
  uVar1 = ~crc;
  if (4 < size) {
    if (((ulong)buf & 3) != 0) {
      puVar5 = buf + 1;
      do {
        uVar6 = *(uint *)buf;
        buf = (uint8_t *)((long)buf + 1);
        uVar1 = uVar1 >> 8 ^ lzma_crc64_table[0][(uint)uVar1 & 0xff ^ (uint)(byte)uVar6];
        size = size - 1;
        uVar2 = (ulong)puVar5 & 3;
        puVar5 = puVar5 + 1;
      } while (uVar2 != 0);
    }
    uVar2 = size & 0xfffffffffffffffc;
    size = (size_t)((uint)size & 3);
    if (0 < (long)uVar2) {
      puVar3 = (uint *)(uVar2 + (long)buf);
      do {
        uVar6 = *(uint *)buf ^ (uint)uVar1;
        buf = (uint8_t *)((long)buf + 4);
        uVar1 = uVar1 >> 0x20 ^ lzma_crc64_table[3][uVar6 & 0xff] ^
                lzma_crc64_table[2][uVar6 >> 8 & 0xff] ^
                *(ulong *)((long)lzma_crc64_table[1] + (ulong)(uVar6 >> 0xd & 0x7f8)) ^
                lzma_crc64_table[0][uVar6 >> 0x18];
      } while (buf < puVar3);
    }
  }
  if (size != 0) {
    sVar4 = 0;
    do {
      uVar1 = uVar1 >> 8 ^
              lzma_crc64_table[0][(uint)uVar1 & 0xff ^ (uint)*(byte *)((long)buf + sVar4)];
      sVar4 = sVar4 + 1;
    } while (size != sVar4);
  }
  return ~uVar1;
}

Assistant:

extern LZMA_API(uint64_t)
lzma_crc64(const uint8_t *buf, size_t size, uint64_t crc)
{
	crc = ~crc;

#ifdef WORDS_BIGENDIAN
	crc = bswap64(crc);
#endif

	if (size > 4) {
		const uint8_t *limit;

		while ((uintptr_t)(buf) & 3) {
			crc = lzma_crc64_table[0][*buf++ ^ A1(crc)] ^ S8(crc);
			--size;
		}

		limit = buf + (size & ~(size_t)(3));
		size &= (size_t)(3);

		while (buf < limit) {
#ifdef WORDS_BIGENDIAN
			const uint32_t tmp = (crc >> 32)
					^ *(const uint32_t *)(buf);
#else
			const uint32_t tmp = crc ^ *(const uint32_t *)(buf);
#endif
			buf += 4;

			crc = lzma_crc64_table[3][A(tmp)]
			    ^ lzma_crc64_table[2][B(tmp)]
			    ^ S32(crc)
			    ^ lzma_crc64_table[1][C(tmp)]
			    ^ lzma_crc64_table[0][D(tmp)];
		}
	}

	while (size-- != 0)
		crc = lzma_crc64_table[0][*buf++ ^ A1(crc)] ^ S8(crc);

#ifdef WORDS_BIGENDIAN
	crc = bswap64(crc);
#endif

	return ~crc;
}